

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void g_bang_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("bng");
  bng_class = class_new(ptVar2,bng_new,bng_free,0x4c0,0,A_GIMME,0);
  class_addbang(bng_class,bng_bang);
  class_doaddfloat(bng_class,bng_float);
  class_addsymbol(bng_class,bng_symbol);
  class_addpointer(bng_class,bng_pointer);
  class_addlist(bng_class,bng_list);
  class_addanything(bng_class,bng_anything);
  p_Var1 = bng_class;
  ptVar2 = gensym("click");
  class_addmethod(p_Var1,bng_click,ptVar2,A_FLOAT,1,1,1,1,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("dialog");
  class_addmethod(p_Var1,bng_dialog,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("loadbang");
  class_addmethod(p_Var1,bng_loadbang,ptVar2,A_DEFFLOAT,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("size");
  class_addmethod(p_Var1,bng_size,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("delta");
  class_addmethod(p_Var1,bng_delta,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("pos");
  class_addmethod(p_Var1,bng_pos,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("flashtime");
  class_addmethod(p_Var1,bng_flashtime,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,bng_color,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("send");
  class_addmethod(p_Var1,bng_send,ptVar2,A_DEFSYM,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("receive");
  class_addmethod(p_Var1,bng_receive,ptVar2,A_DEFSYM,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("label");
  class_addmethod(p_Var1,bng_label,ptVar2,A_DEFSYM,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("label_pos");
  class_addmethod(p_Var1,bng_label_pos,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("label_font");
  class_addmethod(p_Var1,bng_label_font,ptVar2,A_GIMME,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("init");
  class_addmethod(p_Var1,bng_init,ptVar2,A_FLOAT,0);
  p_Var1 = bng_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,iemgui_zoom,ptVar2,A_CANT,0);
  bng_widgetbehavior.w_getrectfn = bng_getrect;
  bng_widgetbehavior.w_displacefn = iemgui_displace;
  bng_widgetbehavior.w_selectfn = iemgui_select;
  bng_widgetbehavior.w_activatefn = (t_activatefn)0x0;
  bng_widgetbehavior.w_deletefn = iemgui_delete;
  bng_widgetbehavior.w_visfn = iemgui_vis;
  bng_widgetbehavior.w_clickfn = bng_newclick;
  class_setwidget(bng_class,&bng_widgetbehavior);
  class_setsavefn(bng_class,bng_save);
  class_setpropertiesfn(bng_class,bng_properties);
  return;
}

Assistant:

void g_bang_setup(void)
{
    bng_class = class_new(gensym("bng"), (t_newmethod)bng_new,
        (t_method)bng_free, sizeof(t_bng), 0, A_GIMME, 0);
    class_addbang(bng_class, bng_bang);
    class_addfloat(bng_class, bng_float);
    class_addsymbol(bng_class, bng_symbol);
    class_addpointer(bng_class, bng_pointer);
    class_addlist(bng_class, bng_list);
    class_addanything(bng_class, bng_anything);
    class_addmethod(bng_class, (t_method)bng_click,
        gensym("click"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(bng_class, (t_method)bng_dialog,
        gensym("dialog"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_loadbang,
        gensym("loadbang"), A_DEFFLOAT, 0);
    class_addmethod(bng_class, (t_method)bng_size,
        gensym("size"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_delta,
        gensym("delta"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_pos,
        gensym("pos"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_flashtime,
        gensym("flashtime"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_color,
        gensym("color"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_send,
        gensym("send"), A_DEFSYM, 0);
    class_addmethod(bng_class, (t_method)bng_receive,
        gensym("receive"), A_DEFSYM, 0);
    class_addmethod(bng_class, (t_method)bng_label,
        gensym("label"), A_DEFSYM, 0);
    class_addmethod(bng_class, (t_method)bng_label_pos,
        gensym("label_pos"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_label_font,
        gensym("label_font"), A_GIMME, 0);
    class_addmethod(bng_class, (t_method)bng_init,
        gensym("init"), A_FLOAT, 0);
    class_addmethod(bng_class, (t_method)iemgui_zoom,
        gensym("zoom"), A_CANT, 0);
    bng_widgetbehavior.w_getrectfn = bng_getrect;
    bng_widgetbehavior.w_displacefn = iemgui_displace;
    bng_widgetbehavior.w_selectfn = iemgui_select;
    bng_widgetbehavior.w_activatefn = NULL;
    bng_widgetbehavior.w_deletefn = iemgui_delete;
    bng_widgetbehavior.w_visfn = iemgui_vis;
    bng_widgetbehavior.w_clickfn = bng_newclick;
    class_setwidget(bng_class, &bng_widgetbehavior);
    class_setsavefn(bng_class, bng_save);
    class_setpropertiesfn(bng_class, bng_properties);
}